

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O0

void __thiscall
glcts::ViewportArray::ScissorAPI::getScissorBoxes
          (ScissorAPI *this,GLint max_viewports,vector<int,_std::allocator<int>_> *out_data)

{
  code *pcVar1;
  int iVar2;
  deUint32 err;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  reference pvVar4;
  int local_2c;
  GLint i;
  Functions *gl;
  vector<int,_std::allocator<int>_> *out_data_local;
  GLint max_viewports_local;
  ScissorAPI *this_local;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  for (local_2c = 0; local_2c < max_viewports; local_2c = local_2c + 1) {
    pcVar1 = *(code **)(CONCAT44(extraout_var,iVar2) + 0x860);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](out_data,(long)(local_2c << 2));
    (*pcVar1)(0xc10,local_2c,pvVar4);
    err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
    glu::checkError(err,"getIntegeri_v",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0x83e);
  }
  return;
}

Assistant:

void ScissorAPI::getScissorBoxes(GLint max_viewports, std::vector<GLint>& out_data)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	for (GLint i = 0; i < max_viewports; ++i)
	{
		gl.getIntegeri_v(GL_SCISSOR_BOX, i, &out_data[i * 4]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "getIntegeri_v");
	}
}